

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *this,ostream *os)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Type t;
  ostream *poVar4;
  ostream *in_RSI;
  Name *in_RDI;
  NoAttribute<avro::Name> *unaff_retaddr;
  int i;
  int count;
  Type in_stack_ffffffffffffffbc;
  ostream *in_stack_ffffffffffffffc0;
  int local_18;
  Name *n;
  
  n = in_RDI;
  Node::type((Node *)in_RDI);
  avro::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  uVar2 = (*(*(_func_int ***)&in_RDI->ns_)[2])();
  if ((uVar2 & 1) != 0) {
    std::operator<<(in_RSI,' ');
    concepts::NoAttribute<avro::Name>::get(unaff_retaddr,(size_t)n);
    avro::operator<<((ostream *)unaff_retaddr,n);
  }
  std::operator<<(in_RSI,'\n');
  iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[4])();
  if (iVar3 == 0) {
    iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[7])();
  }
  for (local_18 = 0; local_18 < iVar3; local_18 = local_18 + 1) {
    Node::type((Node *)in_RDI);
  }
  t = Node::type((Node *)in_RDI);
  bVar1 = isCompound(t);
  if (bVar1) {
    poVar4 = std::operator<<(in_RSI,"end ");
    Node::type((Node *)in_RDI);
    poVar4 = avro::operator<<(poVar4,in_stack_ffffffffffffffbc);
    std::operator<<(poVar4,'\n');
  }
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}